

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,char *name,Header *header,RgbaChannels rgbaChannels,
          int tileXSize,int tileYSize,LevelMode mode,LevelRoundingMode rmode,int numThreads)

{
  TiledOutputFile *this_00;
  ToYa *this_01;
  Header HStack_78;
  TileDescription local_40;
  
  this->_vptr_TiledRgbaOutputFile = (_func_int **)&PTR__TiledRgbaOutputFile_003d8550;
  this->_outputFile = (TiledOutputFile *)0x0;
  this->_toYa = (ToYa *)0x0;
  Header::Header(&HStack_78,header);
  anon_unknown_22::insertChannels(&HStack_78,rgbaChannels,name);
  local_40.mode = mode;
  local_40.roundingMode = rmode;
  local_40.xSize = tileXSize;
  local_40.ySize = tileYSize;
  Header::setTileDescription(&HStack_78,&local_40);
  this_00 = (TiledOutputFile *)operator_new(0x20);
  TiledOutputFile::TiledOutputFile(this_00,name,&HStack_78,numThreads);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_Y) != 0) {
    this_01 = (ToYa *)operator_new(0x50);
    ToYa::ToYa(this_01,this_00,rgbaChannels);
    this->_toYa = this_01;
  }
  Header::~Header(&HStack_78);
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    const char        name[],
    const Header&     header,
    RgbaChannels      rgbaChannels,
    int               tileXSize,
    int               tileYSize,
    LevelMode         mode,
    LevelRoundingMode rmode,
    int               numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (header);
    insertChannels (hd, rgbaChannels, name);
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (name, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}